

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_typed_array_find(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int findIndex)

{
  JSValue new_target;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  JSValueUnion JVar4;
  JSRefCountHeader *p;
  uint uVar5;
  ulong uVar6;
  JSValueUnion JVar7;
  JSValue v;
  JSValue JVar8;
  JSValue JVar9;
  JSValue this_obj;
  ulong local_a8;
  int64_t local_90;
  uint uStack_74;
  JSValue local_68;
  ulong local_58;
  undefined8 local_50;
  JSValueUnion local_48;
  int64_t local_40;
  
  uVar1 = js_typed_array_get_length_internal(ctx,this_val);
  if ((int)uVar1 < 0) {
    v = (JSValue)(ZEXT816(6) << 0x40);
    JVar4.float64 = 0.0;
  }
  else {
    JVar9 = *argv;
    iVar2 = check_function(ctx,*argv);
    if (iVar2 == 0) {
      if (argc < 2) {
        local_90 = 3;
        uVar3 = 0;
        local_a8 = 0;
      }
      else {
        local_90 = argv[1].tag;
        local_a8 = (ulong)argv[1].u.ptr & 0xffffffff00000000;
        uVar3 = (ulong)argv[1].u.ptr & 0xffffffff;
      }
      if (uVar1 != 0) {
        uVar6 = 0;
        do {
          JVar8.tag = 0;
          JVar8.u.ptr = (void *)uVar6;
          v = JS_GetPropertyValue(ctx,this_val,JVar8);
          JVar4 = v.u;
          uVar5 = (uint)v.tag;
          if (uVar5 == 6) {
LAB_0016b488:
            if ((0xfffffff4 < uVar5) &&
               (iVar2 = *JVar4.ptr, *(int *)JVar4.ptr = iVar2 + -1, iVar2 < 2)) {
              __JS_FreeValueRT(ctx->rt,v);
            }
            goto LAB_0016b2f9;
          }
          local_50 = 0;
          new_target.tag = 3;
          new_target.u.ptr = (void *)((ulong)uStack_74 << 0x20);
          this_obj.tag = local_90;
          this_obj.u.ptr = (void *)(local_a8 | uVar3);
          local_68 = v;
          local_58 = uVar6;
          local_48 = this_val.u;
          local_40 = this_val.tag;
          JVar8 = JS_CallInternal(ctx,JVar9,this_obj,new_target,3,&local_68,2);
          if ((int)JVar8.tag == 6) goto LAB_0016b488;
          iVar2 = JS_ToBoolFree(ctx,JVar8);
          if (iVar2 != 0) {
            if (findIndex == 0) {
              JVar4.float64 = JVar4.float64 & 0xffffffff00000000;
            }
            else {
              if ((0xfffffff4 < uVar5) &&
                 (iVar2 = *JVar4.ptr, *(int *)JVar4.ptr = iVar2 + -1, iVar2 < 2)) {
                __JS_FreeValueRT(ctx->rt,v);
              }
              JVar4.float64 = 0.0;
              v.tag = 0;
              v.u.ptr = (void *)uVar6;
            }
            goto LAB_0016b470;
          }
          if ((0xfffffff4 < uVar5) &&
             (iVar2 = *JVar4.ptr, *(int *)JVar4.ptr = iVar2 + -1, iVar2 < 2)) {
            __JS_FreeValueRT(ctx->rt,v);
          }
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
      }
      JVar4.float64 = 0.0;
      JVar7.float64 = 2.12199579047121e-314;
      if (findIndex == 0) {
        JVar7.float64 = JVar4.float64;
      }
      v.tag = (ulong)(findIndex == 0) * 3;
      v.u.float64 = JVar7.float64;
    }
    else {
LAB_0016b2f9:
      JVar4.float64 = 0.0;
      v = (JSValue)(ZEXT816(6) << 0x40);
    }
  }
LAB_0016b470:
  JVar9.tag = v.tag;
  JVar9.u.float64 = (ulong)v.u.ptr & 0xffffffff | JVar4.float64;
  return JVar9;
}

Assistant:

static JSValue js_typed_array_find(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv, int findIndex)
{
    JSValueConst func, this_arg;
    JSValueConst args[3];
    JSValue val, index_val, res;
    int len, k;

    val = JS_UNDEFINED;
    len = js_typed_array_get_length_internal(ctx, this_val);
    if (len < 0)
        goto exception;

    func = argv[0];
    if (check_function(ctx, func))
        goto exception;

    this_arg = JS_UNDEFINED;
    if (argc > 1)
        this_arg = argv[1];

    for(k = 0; k < len; k++) {
        index_val = JS_NewInt32(ctx, k);
        val = JS_GetPropertyValue(ctx, this_val, index_val);
        if (JS_IsException(val))
            goto exception;
        args[0] = val;
        args[1] = index_val;
        args[2] = this_val;
        res = JS_Call(ctx, func, this_arg, 3, args);
        if (JS_IsException(res))
            goto exception;
        if (JS_ToBoolFree(ctx, res)) {
            if (findIndex) {
                JS_FreeValue(ctx, val);
                return index_val;
            } else {
                return val;
            }
        }
        JS_FreeValue(ctx, val);
    }
    if (findIndex)
        return JS_NewInt32(ctx, -1);
    else
        return JS_UNDEFINED;

exception:
    JS_FreeValue(ctx, val);
    return JS_EXCEPTION;
}